

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall kj::Promise<siginfo_t>::wait(Promise<siginfo_t> *this,void *__stat_loc)

{
  SourceLocation location;
  WaitScope *in_RDX;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOr<siginfo_t> result;
  ExceptionOr<siginfo_t> local_228;
  
  local_228.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_228.value.ptr.isSet = false;
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  kj::_::waitImpl((OwnPromiseNode *)__stat_loc,&local_228.super_ExceptionOrValue,in_RDX,location);
  kj::_::convertToReturn<siginfo_t>((siginfo_t *)this,&local_228);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_228);
  return (__pid_t)this;
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}